

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O0

void cdns_readcb(int fd,short what,void *_arg)

{
  server_info *svr_00;
  int iVar1;
  size_t len;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  size_t *psVar5;
  undefined8 in_stack_ffffffffffffeef0;
  undefined4 uVar7;
  undefined8 uVar6;
  size_t sVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int error;
  ssize_t outgoing;
  int sender;
  time_t rtt_ms;
  int rc;
  size_t pktlen;
  char ip_str [55];
  char local_1068 [8];
  char buf [4096];
  long local_60;
  timeval rtt;
  timeval tv;
  server_info *svr;
  dns_request *req;
  void *_arg_local;
  short what_local;
  int fd_local;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffeef0 >> 0x20);
  svr_00 = *_arg;
  if ((what & 1U) == 0) {
    len = recvfrom(fd,local_1068,0x1000,0,(sockaddr *)0x0,(socklen_t *)0x0);
    if (len != 0xffffffffffffffff) {
      fmt_sockaddr_port((sockaddr *)(*_arg + 0x10),(char *)&pktlen,0x37);
      gettimeofday((timeval *)&rtt.tv_usec,(__timezone_ptr_t)0x0);
      local_60 = rtt.tv_usec - *(long *)((long)_arg + 0xa8);
      rtt.tv_sec = tv.tv_sec - *(long *)((long)_arg + 0xb0);
      if (rtt.tv_sec < 0) {
        local_60 = local_60 + -1;
        rtt.tv_sec = rtt.tv_sec + 1000000;
      }
      lVar2 = local_60 * 1000 + rtt.tv_sec / 1000;
      if ((svr_00->hijack_threshold == 0) || ((long)(ulong)svr_00->hijack_threshold < lVar2)) {
        rtt_ms._4_4_ = verify_response((dns_request *)_arg,local_1068,len);
      }
      else {
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0x175,"cdns_readcb",0,7,"Response received from %s too fast!",&pktlen);
        rtt_ms._4_4_ = -1;
      }
      psVar5 = &pktlen;
      iVar10 = (svr_00->stats).avg_rtt;
      uVar6 = CONCAT44(uVar7,(uint)*(ushort *)((long)_arg + 0xc));
      sVar8 = len;
      lVar9 = lVar2;
      iVar11 = rtt_ms._4_4_;
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x17c
                 ,"cdns_readcb",0,7,
                 "svr: %s req_id: %x pktlen: %zu rtt_ms: %ld avg rtt: %u verify_rc: %d",psVar5,uVar6
                 ,len,lVar2,iVar10,rtt_ms._4_4_);
      if (rtt_ms._4_4_ < 0) {
        local_60 = rtt.tv_usec - *(long *)((long)_arg + 0x98);
        rtt.tv_sec = tv.tv_sec - *(long *)((long)_arg + 0xa0);
        if (rtt.tv_sec < 0) {
          local_60 = local_60 + -1;
          rtt.tv_sec = rtt.tv_sec + 1000000;
        }
        rtt.tv_usec = (__suseconds_t)*(ushort *)((long)_arg + 0xe);
        local_60 = rtt.tv_usec - local_60;
        lVar2 = -rtt.tv_sec;
        bVar4 = 0 < rtt.tv_sec;
        rtt.tv_sec = lVar2;
        if (bVar4) {
          local_60 = local_60 + -1;
          rtt.tv_sec = lVar2 + 1000000;
        }
        iVar1 = event_add(*(undefined8 *)((long)_arg + 0x90),&local_60);
        if (iVar1 == 0) {
          return;
        }
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0x1a5,"cdns_readcb",1,3,"event_add",psVar5,uVar6,sVar8,lVar9,iVar10,iVar11);
        cdns_drop_request((dns_request *)_arg);
        return;
      }
      if ((rtt_ms._4_4_ < 1) && (*(short *)((long)_arg + 8) == 1)) {
        *(undefined2 *)((long)_arg + 8) = 2;
      }
      iVar1 = event_get_fd(listener);
      sVar3 = sendto(iVar1,local_1068,len,0,(sockaddr *)((long)_arg + 0x10),0x80);
      if (sVar3 == 0xffffffffffffffff) {
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0x18e,"cdns_readcb",1,7,"sendto: Can\'t forward packet",psVar5,uVar6,sVar8,lVar9,
                   iVar10,iVar11);
      }
      else if (sVar3 == len) {
        update_server_rtt(svr_00,(int)lVar2);
        (svr_00->stats).n_rsp = (svr_00->stats).n_rsp + 1;
      }
      else {
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0x191,"cdns_readcb",0,7,
                   "sendto: I was sending %zd bytes, but only %zd were sent.",len,sVar3,sVar8,lVar9,
                   iVar10,iVar11);
      }
      *(undefined2 *)((long)_arg + 8) = 3;
    }
  }
  else if (*(short *)((long)_arg + 8) != 3) {
    update_server_rtt(svr_00,(uint)*(ushort *)((long)_arg + 0xe) * 1000);
  }
  cdns_drop_request((dns_request *)_arg);
  return;
}

Assistant:

static void cdns_readcb(int fd, short what, void *_arg)
{
    dns_request * req = _arg;
    struct server_info * svr = req->server;
    struct timeval tv, rtt;
    char   buf[DEFAULT_BUFFER_SIZE];
    char   ip_str[INET_ADDR_PORT_STRLEN];
    size_t pktlen;
    int    rc;

    if (what & EV_TIMEOUT) {
        if (req->state != STATE_RESPONSE_SENT) {
            update_server_rtt(svr, req->timeout * 1000);
        }
        goto finish;
    }

    pktlen = recvfrom(fd, &buf[0], sizeof(buf), 0, NULL, NULL);
    if (pktlen == -1)
        goto finish;

    fmt_sockaddr_port((struct sockaddr *)&req->server->addr, &ip_str[0], sizeof(ip_str));
    // Calculate round trip time
    gettimeofday(&tv, 0);
    timersub(&tv, &req->req_fwd_time, &rtt);
    time_t rtt_ms = rtt.tv_sec * 1000 + rtt.tv_usec/1000;
    
    if (svr->hijack_threshold > 0 && rtt_ms <= svr->hijack_threshold) {
        log_error(LOG_DEBUG, "Response received from %s too fast!", &ip_str[0]);
        rc = -1;
    }
    else {
        rc = verify_response(req, &buf[0], pktlen);
    }
    log_error(LOG_DEBUG, "svr: %s req_id: %x pktlen: %zu rtt_ms: %ld avg rtt: %u verify_rc: %d",
              &ip_str[0], req->id, pktlen, rtt_ms, svr->stats.avg_rtt, rc);
    if (rc < 0)
        goto continue_waiting;
    if (rc > 0)
        goto accept;

    // TODO: can not determined?
    if (req->state == STATE_REQUEST_SENT) {
        req->state = STATE_RECV_1ST_RSP;
    }

accept:
    {
        int sender = event_get_fd(listener);
        ssize_t outgoing = sendto(sender, buf, pktlen, 0,
                                  (const struct sockaddr *)&req->client_addr,
                                  sizeof(req->client_addr));
        if (outgoing == -1) {
            log_errno(LOG_DEBUG, "sendto: Can't forward packet");
        }
        else if (outgoing != pktlen) {
            log_error(LOG_DEBUG, "sendto: I was sending %zd bytes, but only %zd were sent.", pktlen, outgoing);
        }
        else {
            update_server_rtt(svr, rtt_ms);
            svr->stats.n_rsp += 1;
        }
        req->state = STATE_RESPONSE_SENT;
    }
finish:
    cdns_drop_request(req);
    return;

continue_waiting:
    timersub(&tv, &req->req_recv_time, &rtt);
    tv.tv_sec = req->timeout;
    tv.tv_usec = 0;
    timersub(&tv, &rtt, &rtt);
    // update with time left for timeout
    int error = event_add(req->resolver, &rtt);
    if (error) {
        log_errno(LOG_ERR, "event_add");
        cdns_drop_request(req);
    }
    return;

}